

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

int __thiscall Settings::extraArgumentChecks(Settings *this)

{
  ostream *poVar1;
  reference pvVar2;
  long in_RDI;
  size_t i;
  size_t N;
  ulong local_20;
  ulong local_18;
  int local_4;
  
  if ((*(long *)(in_RDI + 0x2b8) == 0) && (1 < *(ulong *)(in_RDI + 0xa8))) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "ERROR : Missing decomposition for parallel program (see -d option)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    local_18 = 1;
    for (local_20 = 0; local_20 < *(ulong *)(in_RDI + 0x2b8); local_20 = local_20 + 1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x80),
                          local_20);
      local_18 = *pvVar2 * local_18;
    }
    if (local_18 == *(ulong *)(in_RDI + 0xa8)) {
      local_4 = 0;
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"ERROR : Product of decomposition values = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
      poVar1 = std::operator<<(poVar1," must equal the number of processes = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0xa8));
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int Settings::extraArgumentChecks()
{
    if (!nDecomp && nProc > 1)
    {
        std::cout << "ERROR : Missing decomposition for parallel program (see "
                     "-d option)"
                  << std::endl;
        return 1;
    }

    size_t N = 1;
    for (size_t i = 0; i < nDecomp; ++i)
    {
        N *= processDecomp[i];
    }

    if (N != nProc)
    {
        std::cout << "ERROR : Product of decomposition values = " << N
                  << " must equal the number of processes = " << nProc << std::endl;
        return 1;
    }
    return 0;
}